

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Parser
cm_expat_XML_ExternalEntityParserCreate
          (XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *oldTable;
  HASH_TABLE *newTable;
  STRING_POOL *newPool;
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  XML_Parser pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long *parser;
  NAMED *pNVar25;
  XML_Char *pXVar26;
  undefined1 *puVar27;
  NAMED *pNVar28;
  KEY pXVar29;
  NAMED *pNVar30;
  KEY pXVar31;
  long lVar32;
  long lVar33;
  long *plVar34;
  XML_Char tmp [2];
  
  lVar6 = *(long *)((long)oldParser + 0x68);
  lVar7 = *(long *)((long)oldParser + 0x70);
  lVar8 = *(long *)((long)oldParser + 0x78);
  lVar9 = *(long *)((long)oldParser + 0x80);
  lVar10 = *(long *)((long)oldParser + 0x88);
  lVar11 = *(long *)((long)oldParser + 0x90);
  lVar12 = *(long *)((long)oldParser + 0x98);
  lVar13 = *(long *)((long)oldParser + 0xa0);
  lVar14 = *(long *)((long)oldParser + 0xb8);
  lVar15 = *(long *)((long)oldParser + 0xc0);
  lVar16 = *(long *)((long)oldParser + 200);
  lVar17 = *(long *)((long)oldParser + 0xd0);
  lVar18 = *(long *)((long)oldParser + 0xd8);
  lVar19 = *(long *)((long)oldParser + 0xe0);
  lVar20 = *(long *)((long)oldParser + 0xf0);
  lVar21 = *(long *)((long)oldParser + 0xf8);
  lVar22 = *(long *)((long)oldParser + 0x100);
  lVar23 = *(long *)((long)oldParser + 0x108);
  lVar32 = *(long *)((long)oldParser + 0x110);
  lVar33 = *(long *)((long)oldParser + 0x278);
  plVar34 = *oldParser;
  lVar4 = *(long *)((long)oldParser + 8);
  uVar1 = *(undefined4 *)((long)oldParser + 0x238);
  pvVar5 = *(XML_Parser *)((long)oldParser + 0xe8);
  uVar2 = *(undefined4 *)((long)oldParser + 0x48c);
  uVar3 = *(undefined4 *)((long)oldParser + 0x1cc);
  if (*(int *)((long)oldParser + 0x1c8) == 0) {
    pXVar26 = (XML_Char *)0x0;
  }
  else {
    pXVar26 = tmp;
    _tmp = (NAMED **)CONCAT71(stack0xfffffffffffffe99,*(undefined1 *)((long)oldParser + 0x488));
  }
  parser = (long *)cm_expat_XML_ParserCreate_MM
                             (encodingName,(XML_Memory_Handling_Suite *)((long)oldParser + 0x18),
                              pXVar26);
  if (parser == (long *)0x0) {
    return (XML_Parser)0x0;
  }
  parser[0xd] = lVar6;
  parser[0xe] = lVar7;
  parser[0xf] = lVar8;
  parser[0x10] = lVar9;
  parser[0x11] = lVar10;
  parser[0x12] = lVar11;
  parser[0x13] = lVar12;
  parser[0x14] = lVar13;
  parser[0x17] = lVar14;
  parser[0x18] = lVar15;
  parser[0x19] = lVar16;
  parser[0x1a] = lVar17;
  parser[0x1b] = lVar18;
  parser[0x1c] = lVar19;
  parser[0x1e] = lVar20;
  parser[0x1f] = lVar21;
  parser[0x20] = lVar22;
  parser[0x21] = lVar23;
  parser[0x22] = lVar32;
  parser[0x4f] = lVar33;
  *parser = (long)plVar34;
  if (plVar34 != (long *)lVar4) {
    plVar34 = parser;
  }
  parser[1] = (long)plVar34;
  if (pvVar5 != oldParser) {
    parser[0x1d] = (long)pvVar5;
  }
  oldTable = (HASH_TABLE *)((long)oldParser + 0x290);
  *(undefined4 *)(parser + 0x47) = uVar1;
  *(undefined4 *)((long)parser + 0x1cc) = uVar3;
  *(undefined4 *)((long)parser + 0x48c) = uVar2;
  newTable = (HASH_TABLE *)(parser + 0x52);
  if (context == (XML_Char *)0x0) {
    memcpy(tmp,newTable,0x138);
    memcpy(newTable,oldTable,0x138);
    memcpy(oldTable,tmp,0x138);
    parser[0x92] = (long)oldParser;
    cm_expat_XmlPrologStateInitExternalEntity((PROLOG_STATE *)(parser + 0x3e));
    *(undefined4 *)(parser + 0x6c) = 1;
    *(undefined4 *)((long)parser + 0x484) = 1;
    return parser;
  }
  _tmp = *(NAMED ***)((long)oldParser + 0x308);
  newPool = (STRING_POOL *)(parser + 0x66);
  table = (HASH_TABLE *)(parser + 0x61);
  do {
    pNVar25 = hashTableIterNext((HASH_TABLE_ITER *)tmp);
    if (pNVar25 == (NAMED *)0x0) {
      _tmp = *(NAMED ***)((long)oldParser + 0x2e0);
      table_00 = (HASH_TABLE *)(parser + 0x5c);
      goto LAB_0014afa6;
    }
    pXVar26 = poolCopyString(newPool,pNVar25->name);
  } while ((pXVar26 != (XML_Char *)0x0) &&
          (pNVar25 = lookup(table,pXVar26,0x10), pNVar25 != (NAMED *)0x0));
  goto LAB_0014aee8;
LAB_0014afa6:
  pNVar25 = hashTableIterNext((HASH_TABLE_ITER *)tmp);
  if (pNVar25 != (NAMED *)0x0) {
    puVar27 = (undefined1 *)parser[0x69];
    if (puVar27 == (undefined1 *)parser[0x68]) {
      iVar24 = poolGrow(newPool);
      if (iVar24 == 0) goto LAB_0014aee8;
      puVar27 = (undefined1 *)parser[0x69];
    }
    parser[0x69] = (long)(puVar27 + 1);
    *puVar27 = 0;
    pXVar26 = poolCopyString(newPool,pNVar25->name);
    if ((pXVar26 == (XML_Char *)0x0) ||
       (pNVar28 = lookup(table_00,pXVar26 + 1,0x18), pNVar28 == (NAMED *)0x0)) goto LAB_0014aee8;
    *(undefined1 *)&pNVar28[2].name = *(undefined1 *)&pNVar25[2].name;
    pXVar31 = pNVar25[1].name;
    if (pXVar31 != (KEY)0x0) {
      *(undefined1 *)((long)&pNVar28[2].name + 1) = *(undefined1 *)((long)&pNVar25[2].name + 1);
      pNVar25 = (NAMED *)(parser + 0x72);
      if (pXVar31 != (KEY)((long)oldParser + 0x390)) {
        pNVar25 = lookup(table,*(KEY *)pXVar31,0);
      }
      pNVar28[1].name = (KEY)pNVar25;
    }
    goto LAB_0014afa6;
  }
  _tmp = *(NAMED ***)((long)oldParser + 0x2b8);
  pXVar31 = *(KEY *)((long)oldParser + 0x2c0);
  while (pNVar25 = hashTableIterNext((HASH_TABLE_ITER *)tmp), pNVar25 != (NAMED *)0x0) {
    pXVar26 = poolCopyString(newPool,pNVar25->name);
    if ((pXVar26 == (XML_Char *)0x0) ||
       (pNVar28 = lookup((HASH_TABLE *)(parser + 0x57),pXVar26,0x28), pNVar28 == (NAMED *)0x0))
    goto LAB_0014aee8;
    if ((long)*(int *)&pNVar25[3].name != 0) {
      pXVar29 = (KEY)(*(code *)parser[3])((long)*(int *)&pNVar25[3].name * 0x18);
      pNVar28[4].name = pXVar29;
      if (pXVar29 == (KEY)0x0) goto LAB_0014aee8;
    }
    if (pNVar25[2].name != (KEY)0x0) {
      pNVar30 = lookup(table_00,*(KEY *)pNVar25[2].name,0);
      pNVar28[2].name = (KEY)pNVar30;
    }
    uVar1 = *(undefined4 *)&pNVar25[3].name;
    *(undefined4 *)&pNVar28[3].name = uVar1;
    *(undefined4 *)((long)&pNVar28[3].name + 4) = uVar1;
    if (pNVar25[1].name != (KEY)0x0) {
      pNVar30 = lookup(table,*(KEY *)pNVar25[1].name,0);
      pNVar28[1].name = (KEY)pNVar30;
    }
    lVar33 = 0;
    for (lVar32 = 0; lVar32 < *(int *)&pNVar28[3].name; lVar32 = lVar32 + 1) {
      pNVar30 = lookup(table_00,(KEY)**(undefined8 **)(pNVar25[4].name + lVar33),0);
      pXVar31 = pNVar28[4].name;
      *(NAMED **)(pXVar31 + lVar33) = pNVar30;
      pXVar29 = pNVar25[4].name;
      pXVar31[lVar33 + 8] = pXVar29[lVar33 + 8];
      pXVar26 = *(XML_Char **)(pXVar29 + lVar33 + 0x10);
      if (pXVar26 == (XML_Char *)0x0) {
        pXVar29 = pXVar31 + lVar33 + 0x10;
        pXVar29[0] = '\0';
        pXVar29[1] = '\0';
        pXVar29[2] = '\0';
        pXVar29[3] = '\0';
        pXVar29[4] = '\0';
        pXVar29[5] = '\0';
        pXVar29[6] = '\0';
        pXVar29[7] = '\0';
      }
      else {
        pXVar26 = poolCopyString(newPool,pXVar26);
        pXVar31 = pNVar28[4].name;
        *(XML_Char **)(pXVar31 + lVar33 + 0x10) = pXVar26;
        if (pXVar26 == (XML_Char *)0x0) goto LAB_0014aee8;
      }
      lVar33 = lVar33 + 0x18;
    }
  }
  iVar24 = copyEntityTable(newTable,newPool,oldTable,pXVar31);
  if ((iVar24 != 0) &&
     (iVar24 = copyEntityTable((HASH_TABLE *)(parser + 0x6d),newPool,
                               (HASH_TABLE *)((long)oldParser + 0x368),pXVar31), iVar24 != 0)) {
    parser[0x6c] = *(long *)((long)oldParser + 0x360);
    *(undefined4 *)(parser + 0x74) = *(undefined4 *)((long)oldParser + 0x3a0);
    parser[0x75] = *(long *)((long)oldParser + 0x3a8);
    parser[0x76] = *(long *)((long)oldParser + 0x3b0);
    *(undefined4 *)((long)parser + 0x3bc) = *(undefined4 *)((long)oldParser + 0x3bc);
    parser[0x78] = *(long *)((long)oldParser + 0x3c0);
    iVar24 = setContext(parser,context);
    if (iVar24 != 0) {
      parser[0x41] = (long)externalEntityInitProcessor;
      return parser;
    }
  }
LAB_0014aee8:
  cm_expat_XML_ParserFree(parser);
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XML_ExternalEntityParserCreate(XML_Parser oldParser,
                                          const XML_Char *context,
                                          const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *oldDtd = &dtd;
  XML_StartElementHandler oldStartElementHandler = startElementHandler;
  XML_EndElementHandler oldEndElementHandler = endElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler = characterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler = processingInstructionHandler;
  XML_CommentHandler oldCommentHandler = commentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler = startCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler = endCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler = defaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler = unparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler = notationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler = startNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler = endNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler = notStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler = externalEntityRefHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler = unknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler = elementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler = attlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler = entityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler = xmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType = declElementType;

  void *oldUserData = userData;
  void *oldHandlerArg = handlerArg;
  int oldDefaultExpandInternalEntities = defaultExpandInternalEntities;
  void *oldExternalEntityRefHandlerArg = externalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing = paramEntityParsing;
#endif
  int oldns_triplets = ns_triplets;

  if (ns) {
    XML_Char tmp[2];

    *tmp = namespaceSeparator;
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 tmp);
  }
  else {
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 NULL);
  }

  if (!parser)
    return 0;

  startElementHandler = oldStartElementHandler;
  endElementHandler = oldEndElementHandler;
  characterDataHandler = oldCharacterDataHandler;
  processingInstructionHandler = oldProcessingInstructionHandler;
  commentHandler = oldCommentHandler;
  startCdataSectionHandler = oldStartCdataSectionHandler;
  endCdataSectionHandler = oldEndCdataSectionHandler;
  defaultHandler = oldDefaultHandler;
  unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  notationDeclHandler = oldNotationDeclHandler;
  startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  notStandaloneHandler = oldNotStandaloneHandler;
  externalEntityRefHandler = oldExternalEntityRefHandler;
  unknownEncodingHandler = oldUnknownEncodingHandler;
  elementDeclHandler = oldElementDeclHandler;
  attlistDeclHandler = oldAttlistDeclHandler;
  entityDeclHandler = oldEntityDeclHandler;
  xmlDeclHandler = oldXmlDeclHandler;
  declElementType = oldDeclElementType;
  userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    handlerArg = userData;
  else
    handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  ns_triplets = oldns_triplets;
#ifdef XML_DTD
  paramEntityParsing = oldParamEntityParsing;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(&dtd, oldDtd, parser) || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return 0;
    }
    processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    dtdSwap(&dtd, oldDtd);
    parentParser = oldParser;
    XmlPrologStateInitExternalEntity(&prologState);
    dtd.complete = 1;
    hadExternalDoctype = 1;
  }
#endif /* XML_DTD */
  return parser;
}